

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParamGenerator<solitaire::colliders::CardPositionData> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  ParamGenerator<solitaire::colliders::CardPositionData> PVar2;
  initializer_list<solitaire::colliders::CardPositionData> __l;
  allocator_type local_b1;
  vector<solitaire::colliders::CardPositionData,_std::allocator<solitaire::colliders::CardPositionData>_>
  local_b0;
  CardPositionData local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_98._0_8_ = *in_RSI;
  local_98.cardPosition = *(Position *)(in_RSI + 1);
  local_88 = in_RSI[2];
  uStack_80 = in_RSI[3];
  local_78 = in_RSI[4];
  uStack_70 = in_RSI[5];
  local_68 = in_RSI[6];
  uStack_60 = in_RSI[7];
  local_58 = in_RSI[8];
  uStack_50 = in_RSI[9];
  local_48 = in_RSI[10];
  uStack_40 = in_RSI[0xb];
  local_38 = in_RSI[0xc];
  uStack_30 = in_RSI[0xd];
  local_28 = in_RSI[0xe];
  uStack_20 = in_RSI[0xf];
  __l._M_len = 8;
  __l._M_array = &local_98;
  std::
  vector<solitaire::colliders::CardPositionData,_std::allocator<solitaire::colliders::CardPositionData>_>
  ::vector(&local_b0,__l,&local_b1);
  PVar2 = ValuesIn<__gnu_cxx::__normal_iterator<solitaire::colliders::CardPositionData_const*,std::vector<solitaire::colliders::CardPositionData,std::allocator<solitaire::colliders::CardPositionData>>>>
                    ((__normal_iterator<const_solitaire::colliders::CardPositionData_*,_std::vector<solitaire::colliders::CardPositionData,_std::allocator<solitaire::colliders::CardPositionData>_>_>
                      )this,(__normal_iterator<const_solitaire::colliders::CardPositionData_*,_std::vector<solitaire::colliders::CardPositionData,_std::allocator<solitaire::colliders::CardPositionData>_>_>
                             )local_b0.
                              super__Vector_base<solitaire::colliders::CardPositionData,_std::allocator<solitaire::colliders::CardPositionData>_>
                              ._M_impl.super__Vector_impl_data._M_start);
  _Var1._M_pi = PVar2.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<solitaire::colliders::CardPositionData>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_b0.
      super__Vector_base<solitaire::colliders::CardPositionData,_std::allocator<solitaire::colliders::CardPositionData>_>
      ._M_impl.super__Vector_impl_data._M_start != (CardPositionData *)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<solitaire::colliders::CardPositionData,_std::allocator<solitaire::colliders::CardPositionData>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.
                          super__Vector_base<solitaire::colliders::CardPositionData,_std::allocator<solitaire::colliders::CardPositionData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.
                          super__Vector_base<solitaire::colliders::CardPositionData,_std::allocator<solitaire::colliders::CardPositionData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<solitaire::colliders::CardPositionData>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<solitaire::colliders::CardPositionData>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<solitaire::colliders::CardPositionData>)
         PVar2.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<solitaire::colliders::CardPositionData>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }